

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_dft.hpp
# Opt level: O0

bool __thiscall SlidingDFT<double,_64UL>::update(SlidingDFT<double,_64UL> *this,double new_x)

{
  complex<double> *__x;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 uVar1;
  complex<double> local_178;
  double local_168;
  complex<double> local_160;
  double local_150;
  complex<double> local_148 [2];
  complex<double> local_128;
  double local_118;
  complex<double> local_110;
  double local_100;
  complex<double> local_f8 [2];
  ulong local_d8;
  size_t k_1;
  undefined8 local_c8;
  double local_c0;
  complex<double> local_b8;
  double local_a8;
  complex<double> local_a0 [2];
  double local_80;
  complex<double> local_78;
  complex<double> local_68;
  complex<double> local_58 [2];
  ulong local_38;
  size_t k;
  double r_to_N;
  double r;
  double old_x;
  double new_x_local;
  SlidingDFT<double,_64UL> *this_local;
  
  r = this->x[this->x_index];
  this->x[this->x_index] = new_x;
  r_to_N = this->damping_factor;
  uVar1 = 0x4050000000000000;
  old_x = new_x;
  new_x_local = (double)this;
  k = (size_t)pow(r_to_N,64.0);
  for (local_38 = 0; local_38 < 0x40; local_38 = local_38 + 1) {
    __x = this->twiddle + local_38;
    std::operator*(&r_to_N,this->S + local_38);
    local_80 = (double)k * r;
    local_78._M_value._8_8_ = uVar1;
    std::operator-(&local_78,&local_80);
    local_68._M_value._8_8_ = uVar1;
    std::operator+(&local_68,&old_x);
    local_58[0]._M_value._8_8_ = uVar1;
    std::operator*(__x,local_58);
    *(undefined8 *)this->S[local_38]._M_value = extraout_XMM0_Qa;
    *(undefined8 *)(this->S[local_38]._M_value + 8) = uVar1;
    local_58[1]._M_value._8_8_ = uVar1;
  }
  local_a8 = 0.5;
  std::operator*(&local_a8,this->S);
  local_c0 = 0.25;
  local_a0[0]._M_value._8_8_ = uVar1;
  std::operator+(this->S + 0x3f,this->S + 1);
  local_c8 = uVar1;
  std::operator*(&local_c0,(complex<double> *)&k_1);
  local_b8._M_value._8_8_ = uVar1;
  std::operator-(local_a0,&local_b8);
  *(undefined8 *)this->dft[0]._M_value = extraout_XMM0_Qa_00;
  *(undefined8 *)(this->dft[0]._M_value + 8) = uVar1;
  local_a0[1]._M_value._8_8_ = uVar1;
  for (local_d8 = 1; local_d8 < 0x3f; local_d8 = local_d8 + 1) {
    local_100 = 0.5;
    std::operator*(&local_100,this->S + local_d8);
    local_118 = 0.25;
    local_f8[0]._M_value._8_8_ = uVar1;
    std::operator+(this->S + (local_d8 - 1),this->S + local_d8 + 1);
    local_128._M_value._8_8_ = uVar1;
    std::operator*(&local_118,&local_128);
    local_110._M_value._8_8_ = uVar1;
    std::operator-(local_f8,&local_110);
    *(undefined8 *)this->dft[local_d8]._M_value = extraout_XMM0_Qa_01;
    *(undefined8 *)(this->dft[local_d8]._M_value + 8) = uVar1;
    local_f8[1]._M_value._8_8_ = uVar1;
  }
  local_150 = 0.5;
  std::operator*(&local_150,this->S + 0x3f);
  local_168 = 0.25;
  local_148[0]._M_value._8_8_ = uVar1;
  std::operator+(this->S + 0x3e,this->S);
  local_178._M_value._8_8_ = uVar1;
  std::operator*(&local_168,&local_178);
  local_160._M_value._8_8_ = uVar1;
  std::operator-(local_148,&local_160);
  *(undefined8 *)this->dft[0x3f]._M_value = extraout_XMM0_Qa_02;
  *(undefined8 *)(this->dft[0x3f]._M_value + 8) = uVar1;
  this->x_index = this->x_index + 1;
  if (0x3f < this->x_index) {
    this->data_valid = true;
    this->x_index = 0;
  }
  return (bool)(this->data_valid & 1);
}

Assistant:

bool update(NumberFormat new_x)
	{
		// Update the storage of the time domain values
		const NumberFormat old_x = this->x[this->x_index];
		this->x[this->x_index] = new_x;

		// Update the DFT
		const NumberFormat r = this->damping_factor;
		const NumberFormat r_to_N = pow(r, (NumberFormat)DFT_Length);
		for (size_t k = 0; k < DFT_Length; k++) {
			this->S[k] = this->twiddle[k] * (r * this->S[k] - r_to_N * old_x + new_x);
		}

		// Apply the Hanning window
		this->dft[0] = (NumberFormat)0.5*this->S[0] - (NumberFormat)0.25*(this->S[DFT_Length - 1] + this->S[1]);
		for (size_t k = 1; k < (DFT_Length - 1); k++) {
			this->dft[k] = (NumberFormat)0.5*this->S[k] - (NumberFormat)0.25*(this->S[k - 1] + this->S[k + 1]);
		}
		this->dft[DFT_Length - 1] = (NumberFormat)0.5*this->S[DFT_Length - 1] - (NumberFormat)0.25*(this->S[DFT_Length - 2] + this->S[0]);

		// Increment the counter
		this->x_index++;
		if (this->x_index >= DFT_Length) {
			this->data_valid = true;
			this->x_index = 0;
		}

		// Done.
		return this->data_valid;
	}